

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveShapeFunction.h
# Opt level: O3

void __thiscall
anurbs::NurbsCurveShapeFunction::compute_at_span
          (NurbsCurveShapeFunction *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots,
          Index span,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  PointerType pdVar4;
  Index IVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  Index r;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Index IVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong order;
  bool bVar18;
  double dVar19;
  long local_60;
  long local_58;
  
  clear_values(this);
  lVar6 = this->m_degree;
  lVar16 = (this->m_ndu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_cols;
  this->m_first_nonzero_pole = (span - lVar6) + 1;
  if (((this->m_ndu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
       m_rows < 1) || (lVar16 < 1)) {
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x16d,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                 );
  }
  *(this->m_ndu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       1.0;
  if (0 < lVar6) {
    lVar16 = 0;
    do {
      lVar6 = span - lVar16;
      if ((lVar6 < 0) ||
         (uVar13 = (knots->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                   .m_rows.m_value, (long)uVar13 <= lVar6)) {
LAB_001abd58:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xa2,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator[](Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                     );
      }
      if ((this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar16) goto LAB_001abd39;
      pdVar4 = (knots->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_data;
      pdVar7 = (this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pdVar7[lVar16] = t - pdVar4[lVar6];
      if ((lVar16 + span < -1) || (uVar13 <= lVar16 + span + 1U)) goto LAB_001abd58;
      if ((this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar16) goto LAB_001abd39;
      (this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data[lVar16] = pdVar4[lVar16 + span + 1] - t;
      lVar17 = lVar16 + 1;
      dVar19 = 0.0;
      lVar9 = 0;
      lVar6 = lVar16;
      do {
        if (((this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows <= lVar9) ||
           ((this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar6)) goto LAB_001abd39;
        dVar1 = (this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar9];
        dVar2 = pdVar7[lVar6];
        pdVar7 = ndu(this,lVar17,lVar9);
        *pdVar7 = dVar1 + dVar2;
        pdVar7 = ndu(this,lVar9,lVar16);
        dVar1 = *pdVar7;
        pdVar7 = ndu(this,lVar17,lVar9);
        if ((this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows <= lVar9) goto LAB_001abd39;
        dVar2 = *pdVar7;
        dVar3 = (this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar9];
        pdVar7 = ndu(this,lVar9,lVar17);
        *pdVar7 = dVar3 * (dVar1 / dVar2) + dVar19;
        if ((this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar6) goto LAB_001abd39;
        pdVar7 = (this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        dVar19 = (dVar1 / dVar2) * pdVar7[lVar6];
        lVar9 = lVar9 + 1;
        bVar18 = lVar6 != 0;
        lVar6 = lVar6 + -1;
      } while (bVar18);
      pdVar7 = ndu(this,lVar17,lVar17);
      *pdVar7 = dVar19;
      lVar6 = this->m_degree;
      lVar16 = lVar17;
    } while (lVar17 < lVar6);
  }
  if (-1 < lVar6) {
    lVar16 = -1;
    do {
      lVar16 = lVar16 + 1;
      pdVar7 = ndu(this,lVar16,lVar6);
      dVar19 = *pdVar7;
      pdVar7 = value(this,0,lVar16);
      *pdVar7 = dVar19;
      lVar6 = this->m_degree;
    } while (lVar16 < lVar6);
    if (-1 < lVar6) {
      lVar16 = (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      local_60 = 1;
      uVar13 = 0;
      do {
        if (lVar16 < 1) {
LAB_001abd39:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x198,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        *(this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
             = 1.0;
        lVar17 = this->m_order;
        if (0 < lVar17) {
          local_58 = 0;
          uVar11 = 0;
          order = 1;
          do {
            uVar10 = uVar11;
            if (uVar11 < uVar13) {
              uVar10 = uVar13;
            }
            uVar12 = uVar11;
            if ((long)uVar11 < (long)uVar13) {
              uVar12 = uVar13;
            }
            pdVar7 = value(this,order,uVar13);
            IVar14 = this->m_degree;
            lVar6 = IVar14 - order;
            if (order <= uVar13) {
              if ((this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows < 1) goto LAB_001abd39;
              dVar19 = *(this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              pdVar8 = ndu(this,lVar6 + 1,uVar13 - order);
              if ((this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows < 1) goto LAB_001abd39;
              dVar19 = dVar19 / *pdVar8;
              *(this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data = dVar19;
              pdVar8 = ndu(this,uVar13 - order,lVar6);
              *pdVar7 = dVar19 * *pdVar8;
              IVar14 = this->m_degree;
            }
            lVar16 = lVar6 + 1;
            lVar17 = order - uVar13;
            if (order - 1 <= uVar13) {
              lVar17 = 1;
            }
            uVar15 = (IVar14 - uVar13) + 1;
            if ((long)uVar13 <= lVar16) {
              uVar15 = order;
            }
            if (lVar17 < (long)uVar15) {
              lVar9 = uVar10 + local_58;
              do {
                if ((((long)(uVar12 + local_60) < 0) ||
                    (uVar10 = (this->m_a).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows, (long)uVar10 <= lVar17)) || (uVar10 <= lVar17 - 1U))
                goto LAB_001abd39;
                pdVar8 = (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data;
                dVar19 = pdVar8[lVar17 + -1];
                dVar1 = pdVar8[lVar17];
                pdVar8 = ndu(this,lVar16,lVar9);
                if ((this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows <= lVar17) goto LAB_001abd39;
                dVar19 = (dVar1 - dVar19) / *pdVar8;
                (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_data[lVar17] = dVar19;
                pdVar8 = ndu(this,lVar9,lVar6);
                *pdVar7 = dVar19 * *pdVar8 + *pdVar7;
                lVar9 = lVar9 + 1;
                lVar17 = lVar17 + 1;
              } while (lVar17 < (long)uVar15);
            }
            if ((long)uVar13 <= lVar6) {
              if ((this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows < (long)order) goto LAB_001abd39;
              dVar19 = (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data[order - 1];
              pdVar8 = ndu(this,lVar16,uVar13);
              if ((this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows <= (long)order) goto LAB_001abd39;
              dVar19 = -dVar19 / *pdVar8;
              (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[order] = dVar19;
              pdVar8 = ndu(this,uVar13,lVar6);
              *pdVar7 = dVar19 * *pdVar8 + *pdVar7;
            }
            pdVar7 = (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            IVar5 = (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
            (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            lVar16 = (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = lVar16;
            (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = pdVar7;
            (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = IVar5;
            lVar17 = this->m_order;
            uVar11 = uVar11 + 1;
            local_58 = local_58 + -1;
            bVar18 = (long)order < lVar17;
            order = order + 1;
          } while (bVar18);
          lVar6 = this->m_degree;
        }
        local_60 = local_60 + -1;
        bVar18 = (long)uVar13 < lVar6;
        uVar13 = uVar13 + 1;
      } while (bVar18);
      goto LAB_001abcc3;
    }
  }
  lVar17 = this->m_order;
LAB_001abcc3:
  if (0 < lVar17) {
    lVar16 = lVar6;
    lVar9 = 1;
    do {
      if (-1 < lVar6) {
        lVar17 = -1;
        do {
          lVar17 = lVar17 + 1;
          pdVar7 = value(this,lVar9,lVar17);
          *pdVar7 = *pdVar7 * (double)lVar16;
          lVar6 = this->m_degree;
        } while (lVar17 < lVar6);
        lVar17 = this->m_order;
      }
      lVar16 = lVar16 * (lVar6 - lVar9);
      bVar18 = lVar9 < lVar17;
      lVar9 = lVar9 + 1;
    } while (bVar18);
  }
  return;
}

Assistant:

void compute_at_span(Eigen::Ref<const Eigen::VectorXd> knots, const Index span, const double t)
    {
        clear_values();

        m_first_nonzero_pole = span - degree() + 1;

        // compute B-Spline shape

        ndu(0, 0) = 1.0;

        for (Index j = 0; j < degree(); j++) {
            m_left[j] = t - knots[span - j];
            m_right[j] = knots[span + j + 1] - t;

            double saved = 0.0;

            for (Index r = 0; r <= j; r++) {
                ndu(j + 1, r) = m_right[r] + m_left[j - r];

                double temp = ndu(r, j) / ndu(j + 1, r);

                ndu(r, j + 1) = saved + m_right[r] * temp;

                saved = m_left[j - r] * temp;
            }

            ndu(j + 1, j + 1) = saved;
        }

        for (Index j = 0; j < nb_nonzero_poles(); j++) {
            value(0, j) = ndu(j, degree());
        }

        auto& a = m_a;
        auto& b = m_b;

        for (Index r = 0; r < nb_nonzero_poles(); r++) {
            a[0] = 1.0;

            for (Index k = 1; k < nb_shapes(); k++) {
                double& v = value(k, r);

                Index rk = r - k;
                Index pk = degree() - k;

                if (r >= k) {
                    b[0] = a[0] / ndu(pk + 1, rk);
                    v = b[0] * ndu(rk, pk);
                }

                Index j1 = r >= k - 1 ? 1 : k - r;
                Index j2 = r <= pk + 1 ? k : nb_nonzero_poles() - r;

                for (Index j = j1; j < j2; j++) {
                    b[j] = (a[j] - a[j - 1]) / ndu(pk + 1, rk + j);
                    v += b[j] * ndu(rk + j, pk);
                }

                if (r <= pk) {
                    b[k] = -a[k - 1] / ndu(pk + 1, r);
                    v += b[k] * ndu(r, pk);
                }

                std::swap(a, b);
            }
        }

        Index s = degree();

        for (Index k = 1; k < nb_shapes(); k++) {
            for (Index j = 0; j < nb_nonzero_poles(); j++) {
                value(k, j) *= s;
            }
            s *= degree() - k;
        }
    }